

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall ipx::Basis::PivotFreeVariablesIntoBasis(Basis *this,double *colweights,Info *info)

{
  bool bVar1;
  uint uVar2;
  Int IVar3;
  int iVar4;
  double *pdVar5;
  reference pvVar6;
  ostream *poVar7;
  size_type sVar8;
  undefined4 extraout_var;
  long in_RDX;
  void *extraout_RDX;
  long in_RSI;
  double **ppdVar9;
  undefined8 *in_RDI;
  double extraout_XMM0_Qa;
  stringstream h_logging_stream;
  bool exchanged_1;
  Int jb_1;
  anon_class_32_4_8cdf9ef1 update_delta_obj;
  double delta_obj;
  Vector *c;
  bool exchanged;
  Int jb;
  anon_class_48_6_c9aeef18 update_max;
  double fmax_nonfree;
  double fmax;
  Int pmax_nonfree;
  Int pmax;
  Int jn;
  Int j;
  vector<int,_std::allocator<int>_> remaining;
  Int stability_pivots;
  double dependency_tol;
  IndexedVector ftran;
  Int n;
  Int m;
  double in_stack_fffffffffffffbd8;
  IndexedVector *in_stack_fffffffffffffbe0;
  value_type_conflict2 *in_stack_fffffffffffffbe8;
  ostream *in_stack_fffffffffffffbf0;
  ostream *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  Int in_stack_fffffffffffffc0c;
  value_type in_stack_fffffffffffffc10;
  value_type in_stack_fffffffffffffc14;
  Basis *in_stack_fffffffffffffc18;
  IndexedVector *in_stack_fffffffffffffc20;
  IndexedVector *in_stack_fffffffffffffc30;
  double in_stack_fffffffffffffc38;
  Basis *in_stack_fffffffffffffc40;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  Int in_stack_fffffffffffffc5c;
  string local_350 [24];
  stringstream *in_stack_fffffffffffffcc8;
  Control *in_stack_fffffffffffffcd0;
  stringstream local_310 [16];
  stringstream local_300 [120];
  char (*in_stack_fffffffffffffd78) [48];
  byte local_185;
  string local_180 [32];
  string local_160 [40];
  long *local_138;
  Control **local_130;
  valarray<double> *local_128;
  Control *local_120;
  valarray<double> *local_118;
  byte local_10d;
  value_type local_10c;
  double *local_108;
  int *local_100;
  long *local_f8;
  double *local_e8;
  int *local_e0;
  double local_d8;
  double local_d0;
  int local_c8;
  int local_c4 [2];
  value_type local_bc;
  string local_b8 [36];
  int local_94;
  vector<int,_std::allocator<int>_> local_90;
  int local_78;
  double local_68;
  double local_60;
  double local_58;
  undefined1 local_50 [48];
  Int local_20;
  Int local_1c;
  long local_18;
  long local_10 [2];
  
  local_18 = in_RDX;
  local_10[0] = in_RSI;
  local_1c = Model::rows((Model *)in_RDI[1]);
  local_20 = Model::cols((Model *)in_RDI[1]);
  IndexedVector::IndexedVector
            ((IndexedVector *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc0c);
  local_60 = 0.0;
  local_68 = Control::dependency_tol((Control *)*in_RDI);
  pdVar5 = std::max<double>(&local_60,&local_68);
  local_58 = *pdVar5;
  *(undefined4 *)(local_18 + 0xc) = 0;
  *(undefined4 *)(local_18 + 0x3c) = 0;
  local_78 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x80d3a0);
  for (local_94 = 0; local_94 < local_20 + local_1c; local_94 = local_94 + 1) {
    uVar2 = std::isinf(*(double *)(local_10[0] + (long)local_94 * 8));
    if (((uVar2 & 1) != 0) &&
       (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_94),
       *pvVar6 < 0)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8);
    }
  }
  poVar7 = Control::Debug((Control *)*in_RDI,1);
  Textline<char[35]>((char (*) [35])in_stack_fffffffffffffd78);
  poVar7 = std::operator<<(poVar7,local_b8);
  sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_90);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
  std::operator<<(poVar7,'\n');
  std::__cxx11::string::~string(local_b8);
  Control::ResetPrintInterval((Control *)0x80d525);
LAB_0080d529:
  do {
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      poVar7 = Control::Debug((Control *)*in_RDI,1);
      Textline<char[48]>(in_stack_fffffffffffffd78);
      in_stack_fffffffffffffbe0 = (IndexedVector *)std::operator<<(poVar7,local_350);
      poVar7 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffbe0,local_78);
      std::operator<<(poVar7,'\n');
      std::__cxx11::string::~string(local_350);
      local_c4[1] = 0;
LAB_0080dc84:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0);
      IndexedVector::~IndexedVector(in_stack_fffffffffffffbe0);
      return;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0);
    local_bc = *pvVar6;
    IVar3 = Control::InterruptCheck
                      ((Control *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (Int)((ulong)in_stack_fffffffffffffc50 >> 0x20));
    *(Int *)(local_18 + 0xc) = IVar3;
    if (IVar3 != 0) {
      local_c4[1] = 1;
      goto LAB_0080dc84;
    }
    SolveForUpdate(in_stack_fffffffffffffc40,(Int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                   in_stack_fffffffffffffc30);
    local_c4[0] = -1;
    local_c8 = -1;
    local_d0 = 0.0;
    local_d8 = 0.0;
    local_108 = &local_d0;
    local_100 = local_c4;
    local_f8 = local_10;
    local_e8 = &local_d8;
    local_e0 = &local_c8;
    ppdVar9 = &local_108;
    for_each_nonzero<ipx::Basis::PivotFreeVariablesIntoBasis(double_const*,ipx::Info*)::__0>
              (in_stack_fffffffffffffc20,(anon_class_48_6_c9aeef18 *)in_stack_fffffffffffffc18);
    if ((local_d0 <= 4.0) || (1.0 <= local_d8)) {
      if (local_d8 <= local_58) {
        if (*(int *)(local_18 + 0x44) == 0) {
          iVar4 = Model::c((Model *)in_RDI[1],ppdVar9,extraout_RDX);
          local_118 = (valarray<double> *)CONCAT44(extraout_var,iVar4);
          in_stack_fffffffffffffc40 =
               (Basis *)std::valarray<double>::operator[](local_118,(long)local_bc);
          local_120 = in_stack_fffffffffffffc40->control_;
          local_138 = local_10;
          local_130 = &local_120;
          local_128 = local_118;
          iVar4 = (int)local_50;
          for_each_nonzero<ipx::Basis::PivotFreeVariablesIntoBasis(double_const*,ipx::Info*)::__1>
                    (in_stack_fffffffffffffc20,(anon_class_32_4_8cdf9ef1 *)in_stack_fffffffffffffc18
                    );
          std::abs(iVar4);
          in_stack_fffffffffffffc38 = extraout_XMM0_Qa;
          if (local_58 < extraout_XMM0_Qa) {
            in_stack_fffffffffffffc30 = (IndexedVector *)Control::Debug((Control *)*in_RDI,1);
            Textline<char[44]>((char (*) [44])in_stack_fffffffffffffd78);
            poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffc30,local_160);
            sci2_abi_cxx11_(in_stack_fffffffffffffbd8);
            in_stack_fffffffffffffc20 = (IndexedVector *)std::operator<<(poVar7,local_180);
            std::operator<<((ostream *)in_stack_fffffffffffffc20,'\n');
            std::__cxx11::string::~string(local_180);
            std::__cxx11::string::~string(local_160);
            *(undefined4 *)(local_18 + 0x44) = 1;
          }
        }
        *(int *)(local_18 + 0x3c) = *(int *)(local_18 + 0x3c) + 1;
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x80da09);
        goto LAB_0080daf4;
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_c8);
      in_stack_fffffffffffffc10 = *pvVar6;
      in_stack_fffffffffffffc14 = local_bc;
      in_stack_fffffffffffffc18 =
           (Basis *)IndexedVector::operator[]
                              (in_stack_fffffffffffffbe0,
                               (Int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      in_stack_fffffffffffffc0c =
           ExchangeIfStable(in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
                            in_stack_fffffffffffffc10,
                            (double)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                            (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                            (bool *)in_stack_fffffffffffffbf8);
      *(Int *)(local_18 + 0xc) = in_stack_fffffffffffffc0c;
      if (*(int *)(local_18 + 0xc) == 0) break;
      local_c4[1] = 1;
      goto LAB_0080dc84;
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_c4[0]);
    local_10c = *pvVar6;
    IndexedVector::operator[]
              (in_stack_fffffffffffffbe0,(Int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
    in_stack_fffffffffffffc5c =
         ExchangeIfStable(in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
                          in_stack_fffffffffffffc10,
                          (double)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                          (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                          (bool *)in_stack_fffffffffffffbf8);
    *(Int *)(local_18 + 0xc) = in_stack_fffffffffffffc5c;
    if (*(int *)(local_18 + 0xc) != 0) {
      local_c4[1] = 1;
      goto LAB_0080dc84;
    }
    if ((local_10d & 1) != 0) {
      in_stack_fffffffffffffc50 = &local_90;
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x80d7a4);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                 in_stack_fffffffffffffbe8);
      *(int *)(local_18 + 0xd0) = *(int *)(local_18 + 0xd0) + 1;
      local_78 = local_78 + 1;
      goto LAB_0080daf4;
    }
  } while( true );
  if ((local_185 & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)0x80dadb);
    *(int *)(local_18 + 0xd0) = *(int *)(local_18 + 0xd0) + 1;
LAB_0080daf4:
    std::__cxx11::stringstream::stringstream(local_310);
    in_stack_fffffffffffffc00 = (string *)&stack0xfffffffffffffcd0;
    std::__cxx11::string::string(in_stack_fffffffffffffc00);
    std::__cxx11::stringstream::str((string *)local_310);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd0);
    in_stack_fffffffffffffbf8 = std::operator<<((ostream *)(local_310 + 0x10)," ");
    sVar8 = std::vector<int,_std::allocator<int>_>::size(&local_90);
    in_stack_fffffffffffffbf0 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffbf8,sVar8)
    ;
    std::operator<<(in_stack_fffffffffffffbf0," free variables remaining\n");
    Control::hIntervalLog(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    std::__cxx11::stringstream::~stringstream(local_310);
  }
  goto LAB_0080d529;
}

Assistant:

void Basis::PivotFreeVariablesIntoBasis(const double* colweights, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    IndexedVector ftran(m);
    const double dependency_tol = std::max(0.0, control_.dependency_tol());
    info->errflag = 0;
    info->dependent_cols = 0;
    Int stability_pivots = 0;

    // Maintain stack of free nonbasic variables.
    std::vector<Int> remaining;
    for (Int j = 0; j < n+m; j++) {
        if (std::isinf(colweights[j]) && map2basis_[j] < 0)
            remaining.push_back(j);
    }
    control_.Debug() << Textline("Number of free variables nonbasic:")
                  << remaining.size() << '\n';

    control_.ResetPrintInterval();
    while (!remaining.empty()) {
        Int jn = remaining.back();
        assert(std::isinf(colweights[jn]));
        assert(map2basis_[jn] < 0);
        if ((info->errflag = control_.InterruptCheck()) != 0)
            return;

        SolveForUpdate(jn, ftran);
        Int pmax = -1;
        Int pmax_nonfree = -1;
        double fmax = 0.0;
        double fmax_nonfree = 0.0;
        auto update_max = [&](Int p, double f) {
            f = std::abs(f);
            if (f > fmax) {
                fmax = f;
                pmax = p;
            }
            if (!std::isinf(colweights[basis_[p]])) {
                if (f > fmax_nonfree) {
                    fmax_nonfree = f;
                    pmax_nonfree = p;
                }
            }
        };
        for_each_nonzero(ftran, update_max);

        if (fmax > 4.0 && fmax_nonfree < 1.0) {
            Int jb = basis_[pmax];
            assert(std::isinf(colweights[jb]));
            bool exchanged;
            info->errflag = ExchangeIfStable(jb, jn, ftran[pmax], -1,
                                             &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            remaining.pop_back();
            remaining.push_back(jb);
            info->updates_start++;
            stability_pivots++;
        } else {
            if (fmax_nonfree <= dependency_tol) {
                // jn cannot be pivoted into the basis. If we do not have an
                // unbounded primal ray yet, then test if column jn yields one.
                // Compute the change in the primal objective that is caused by
                // a unit increase of x[jn] with corresponding adjustment of
                // free basic variables.
                if (!info->cols_inconsistent) {
                    const Vector& c = model_.c();
                    double delta_obj = c[jn];
                    auto update_delta_obj = [&](Int p, double f) {
                        Int j = basis_[p];
                        if (std::isinf(colweights[j]))
                            delta_obj -= c[j] * f;
                    };
                    for_each_nonzero(ftran, update_delta_obj);
                    if (std::abs(delta_obj) > dependency_tol) {
                        control_.Debug()
                            << Textline(
                                "Unbounded primal ray with objective change:")
                            << sci2(delta_obj) << '\n';
                        info->cols_inconsistent = true;
                    }
                }
                info->dependent_cols++;
                remaining.pop_back();
            } else {
                Int jb = basis_[pmax_nonfree];
                bool exchanged;
                info->errflag = ExchangeIfStable(jb, jn, ftran[pmax_nonfree],
                                                 -1, &exchanged);
                if (info->errflag)
                    return;
                if (!exchanged)     // factorization was unstable, try again
                    continue;
                remaining.pop_back();
                info->updates_start++;
            }
        }
	std::stringstream h_logging_stream;
	h_logging_stream.str(std::string());
	h_logging_stream << " " << remaining.size() << " free variables remaining\n";
	control_.hIntervalLog(h_logging_stream);
    }
    control_.Debug()
        << Textline("Number of free variables swapped for stability:")
        << stability_pivots << '\n';
}